

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ws.c
# Opt level: O0

void test_text(void)

{
  int sock;
  char local_28 [2];
  undefined1 local_26;
  uint8_t bad [20];
  int opt;
  int sc;
  int sb;
  
  sock = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                          ,0x2e,1,0x10);
  bad._16_4_ = test_socket_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                                ,0x2f,1,0x10);
  nn_sleep(200);
  bad[0xc] = '\x01';
  bad[0xd] = '\0';
  bad[0xe] = '\0';
  bad[0xf] = '\0';
  test_setsockopt_impl
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
             0x35,sock,-4,1,bad + 0xc,4);
  bad[0xc] = '\x01';
  bad[0xd] = '\0';
  bad[0xe] = '\0';
  bad[0xf] = '\0';
  test_setsockopt_impl
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
             0x37,bad._16_4_,-4,1,bad + 0xc,4);
  bad[0xc] = 0xf4;
  bad[0xd] = '\x01';
  bad[0xe] = '\0';
  bad[0xf] = '\0';
  test_setsockopt_impl
            ("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c",
             0x39,sock,0,5,bad + 0xc,4);
  test_bind_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                 ,0x3b,sock,socket_address);
  test_connect_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                    ,0x3c,bad._16_4_,socket_address);
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                 ,0x3e,bad._16_4_,"GOOD");
  test_recv_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                 ,0x3f,sock,"GOOD");
  strcpy(local_28,"BAD.");
  local_26 = 0xdd;
  test_send_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                 ,0x44,bad._16_4_,local_28);
  test_drop_impl("/workspace/llm4binary/github/license_all_cmakelists_25/Snaipe[P]nanomsg/tests/ws.c"
                 ,0x47,sock,0x6e);
  return;
}

Assistant:

void test_text() {

    int sb;
    int sc;
    int opt;
    uint8_t bad[20];

    /*  Negative testing... bad UTF-8 data for text. */
    sb = test_socket (AF_SP, NN_PAIR);
    sc = test_socket (AF_SP, NN_PAIR);

    /*  Wait for connects to establish. */
    nn_sleep (200);

    opt = NN_WS_MSG_TYPE_TEXT;
    test_setsockopt(sb, NN_WS, NN_WS_MSG_TYPE, &opt, sizeof (opt));
    opt = NN_WS_MSG_TYPE_TEXT;
    test_setsockopt(sc, NN_WS, NN_WS_MSG_TYPE, &opt, sizeof (opt));
    opt = 500;
    test_setsockopt(sb, NN_SOL_SOCKET, NN_RCVTIMEO, &opt, sizeof (opt));

    test_bind (sb, socket_address);
    test_connect (sc, socket_address);

    test_send (sc, "GOOD");
    test_recv (sb, "GOOD");

    /*  and the bad ... */
    strcpy((char *)bad, "BAD.");
    bad[2] = (char)0xDD;
    test_send (sc, (char *)bad);

    /*  Make sure we dropped the frame. */
    test_drop (sb, ETIMEDOUT);
}